

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.tab.cpp
# Opt level: O2

void yy_stack_print(yy_state_t *yybottom,yy_state_t *yytop)

{
  fwrite("Stack now",9,1,_stderr);
  for (; yybottom <= yytop; yybottom = yybottom + 1) {
    fprintf(_stderr," %d",(ulong)*yybottom);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

static void
yy_stack_print (yy_state_t *yybottom, yy_state_t *yytop)
{
  YYFPRINTF (stderr, "Stack now");
  for (; yybottom <= yytop; yybottom++)
    {
      int yybot = *yybottom;
      YYFPRINTF (stderr, " %d", yybot);
    }
  YYFPRINTF (stderr, "\n");
}